

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

AssertionExpr * slang::ast::bindUnknownPortConn(ASTContext *context,PropertyExprSyntax *syntax)

{
  Scope *pSVar1;
  Compilation *this;
  Type *args_1;
  bool bVar2;
  Symbol *args;
  bool bVar3;
  int iVar4;
  SimplePropertyExprSyntax *pSVar5;
  SimpleSequenceExprSyntax *pSVar6;
  ParenthesizedExpressionSyntax *pPVar7;
  Lookup *this_00;
  ASTContext *args_00;
  undefined4 extraout_var;
  char *func;
  LookupResult *in_R8;
  SyntaxNode *pSVar8;
  SimpleAssertionExpr *unaff_R15;
  LookupResult result;
  SourceRange local_228;
  Symbol *local_218;
  undefined5 uStack_210;
  undefined3 uStack_20b;
  undefined5 uStack_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [192];
  SmallVectorBase<slang::Diagnostic> local_128;
  
  if ((syntax->super_SyntaxNode).kind == SimplePropertyExpr) {
    pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePropertyExprSyntax>
                       (&syntax->super_SyntaxNode);
    pSVar8 = &((pSVar5->expr).ptr)->super_SyntaxNode;
    if (pSVar8 == (SyntaxNode *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::SequenceExprSyntax *>::get() const [T = slang::syntax::SequenceExprSyntax *]"
      ;
LAB_001be71b:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,func);
    }
    if (pSVar8->kind == SimpleSequenceExpr) {
      pSVar6 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleSequenceExprSyntax>(pSVar8);
      bVar2 = true;
      if (pSVar6->repetition == (SequenceRepetitionSyntax *)0x0) {
        pSVar8 = &((pSVar6->expr).ptr)->super_SyntaxNode;
        while (pSVar8 != (SyntaxNode *)0x0) {
          if (pSVar8->kind != ParenthesizedExpression) {
            bVar3 = slang::syntax::NameSyntax::isKind(pSVar8->kind);
            if (bVar3) {
              local_218 = (Symbol *)0x0;
              uStack_210 = 0;
              uStack_20b = 0;
              uStack_208 = 0;
              local_1f8 = 0;
              local_1f0 = 4;
              local_128.data_ = (pointer)local_128.firstElement;
              local_128.len = 0;
              local_128.cap = 2;
              local_200 = local_1e8;
              this_00 = (Lookup *)slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(pSVar8);
              args_00 = context;
              Lookup::name(this_00,(NameSyntax *)context,(ASTContext *)0x0,
                           (bitmask<slang::ast::LookupFlags>)(underlying_type)&local_218,in_R8);
              args = local_218;
              bVar2 = true;
              if (((local_218 != (Symbol *)0x0) && ((ulong)local_218->kind < 0x30)) &&
                 ((0xa60000000000U >> ((ulong)local_218->kind & 0x3f) & 1) != 0)) {
                pSVar1 = (context->scope).ptr;
                if (pSVar1 == (Scope *)0x0) {
                  assert::assertFailed
                            ("ptr",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                             ,0x26,
                             "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                            );
                }
                this = pSVar1->compilation;
                args_1 = this->voidType;
                local_228 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
                args_00 = (ASTContext *)
                          BumpAllocator::
                          emplace<slang::ast::HierarchicalReferenceExpression,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::SourceRange>
                                    (&this->super_BumpAllocator,args,args_1,&local_228);
                unaff_R15 = BumpAllocator::
                            emplace<slang::ast::SimpleAssertionExpr,slang::ast::HierarchicalReferenceExpression&,std::nullopt_t_const&>
                                      (&this->super_BumpAllocator,
                                       (HierarchicalReferenceExpression *)args_00,
                                       (nullopt_t *)&std::nullopt);
                bVar2 = false;
              }
              SmallVectorBase<slang::Diagnostic>::cleanup(&local_128,(EVP_PKEY_CTX *)args_00);
              if (local_200 != local_1e8) {
                free(local_200);
              }
            }
            goto LAB_001be6da;
          }
          pPVar7 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>
                             (pSVar8);
          pSVar8 = &((pPVar7->expression).ptr)->super_SyntaxNode;
        }
        func = 
        "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
        ;
        goto LAB_001be71b;
      }
LAB_001be6da:
      if (!bVar2) {
        return &unaff_R15->super_AssertionExpr;
      }
    }
  }
  iVar4 = AssertionExpr::bind((AssertionExpr *)syntax,(int)context,(sockaddr *)0x0,0);
  return (AssertionExpr *)CONCAT44(extraout_var,iVar4);
}

Assistant:

static const AssertionExpr* bindUnknownPortConn(const ASTContext& context,
                                                const PropertyExprSyntax& syntax) {
    // We have to check for a simple reference to an interface instance or port here,
    // since we don't know whether this is an interface port connection or even
    // a normal connection with a virtual interface type.
    const SyntaxNode* node = &syntax;
    if (node->kind == SyntaxKind::SimplePropertyExpr) {
        node = node->as<SimplePropertyExprSyntax>().expr;
        if (node->kind == SyntaxKind::SimpleSequenceExpr) {
            auto& simpSeq = node->as<SimpleSequenceExprSyntax>();
            if (!simpSeq.repetition) {
                const ExpressionSyntax* expr = simpSeq.expr;
                while (expr->kind == SyntaxKind::ParenthesizedExpression)
                    expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                if (NameSyntax::isKind(expr->kind)) {
                    LookupResult result;
                    Lookup::name(expr->as<NameSyntax>(), context, LookupFlags::None, result);
                    if (result.found) {
                        auto symbol = result.found;
                        if (symbol->kind == SymbolKind::Modport ||
                            symbol->kind == SymbolKind::InterfacePort ||
                            symbol->kind == SymbolKind::Instance ||
                            symbol->kind == SymbolKind::InstanceArray) {
                            auto& comp = context.getCompilation();
                            auto hre = comp.emplace<HierarchicalReferenceExpression>(
                                *symbol, comp.getVoidType(), syntax.sourceRange());
                            return comp.emplace<SimpleAssertionExpr>(*hre, std::nullopt);
                        }
                    }
                }
            }
        }
    }

    return &AssertionExpr::bind(syntax, context);
}